

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Int FT_Get_Charmap_Index(FT_CharMap charmap)

{
  FT_Face pFVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0xffffffffffffffff;
  if ((charmap != (FT_CharMap)0x0) && (pFVar1 = charmap->face, pFVar1 != (FT_Face)0x0)) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)pFVar1->num_charmaps;
    if (pFVar1->num_charmaps < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (pFVar1->charmaps[uVar3] == charmap) {
        uVar2 = uVar3 & 0xffffffff;
        break;
      }
    }
  }
  return (FT_Int)uVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Int )
  FT_Get_Charmap_Index( FT_CharMap  charmap )
  {
    FT_Int  i;


    if ( !charmap || !charmap->face )
      return -1;

    for ( i = 0; i < charmap->face->num_charmaps; i++ )
      if ( charmap->face->charmaps[i] == charmap )
        break;

    FT_ASSERT( i < charmap->face->num_charmaps );

    return i;
  }